

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

Vec_Int_t * Ivy_ManLatches(Ivy_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Ivy_Obj_t *pObj_00;
  int local_24;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Int_t *vLatches;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ManLatchNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsLatch(pObj_00), iVar1 != 0)) {
      Vec_IntPush(p_00,pObj_00->Id);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Ivy_ManLatches( Ivy_Man_t * p )
{
    Vec_Int_t * vLatches;
    Ivy_Obj_t * pObj;
    int i;
    vLatches = Vec_IntAlloc( Ivy_ManLatchNum(p) );
    Ivy_ManForEachLatch( p, pObj, i )
        Vec_IntPush( vLatches, pObj->Id );
    return vLatches;
}